

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-reader.hpp
# Opt level: O3

uint64_t yactfr::internal::anon_unknown_0::readFlUIntBe5At5(uint8_t *buf)

{
  return (ulong)((uint)(buf[1] >> 6) + (*buf & 7) * 4);
}

Assistant:

std::uint64_t readFlUIntBe5At5(const std::uint8_t * const buf) {
    std::uint64_t res = 0;

    res |= buf[0];
    res <<= 2;
    res |= (buf[1] >> 6);
    res &= UINT64_C(0x1f);
    return res;
}